

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# area_light.h
# Opt level: O2

void __thiscall
CGL::GLScene::AreaLight::AreaLight(AreaLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  Vector3D dim_x;
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_b8;
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_98;
  double local_78;
  double dStack_70;
  double dStack_68;
  undefined8 uStack_60;
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_58;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_00229320;
  (this->spectrum).field_0.field_0.z = 0.0;
  (this->spectrum).field_0.field_0.x = 0.0;
  (this->spectrum).field_0.field_0.y = 0.0;
  (this->position).field_0.field_0.z = 0.0;
  (this->position).field_0.field_0.x = 0.0;
  (this->position).field_0.field_0.y = 0.0;
  (this->direction).field_0.field_0.x = 0.0;
  (this->direction).field_0.field_0.y = 0.0;
  (this->direction).field_0.field_0.z = 0.0;
  (this->dim_x).field_0.field_0.x = 0.0;
  (this->dim_x).field_0.field_0.y = 0.0;
  (this->dim_x).field_0.field_0.z = 0.0;
  (this->dim_y).field_0.field_0.x = 0.0;
  (this->dim_y).field_0.field_0.y = 0.0;
  (this->dim_y).field_0.field_0.z = 0.0;
  dVar1 = (light_info->spectrum).field_0.field_0.y;
  dVar2 = (light_info->spectrum).field_0.field_0.z;
  uVar6 = *(undefined8 *)((long)&(light_info->spectrum).field_0 + 0x18);
  (this->spectrum).field_0.field_0.x = (light_info->spectrum).field_0.field_0.x;
  (this->spectrum).field_0.field_0.y = dVar1;
  (this->spectrum).field_0.field_0.z = dVar2;
  *(undefined8 *)((long)&(this->spectrum).field_0 + 0x18) = uVar6;
  local_b8.field_0.x = (light_info->position).field_0.field_0.x;
  local_b8.field_0.y = (light_info->position).field_0.field_0.y;
  local_b8.field_0.z = (light_info->position).field_0.field_0.z;
  local_b8.field_0.w = 1.0;
  Matrix4x4::operator*(transform,(Vector4D *)&local_b8.field_0);
  Vector4D::to3D((Vector4D *)&local_98.field_0);
  (this->position).field_0.field_0.x = local_78;
  (this->position).field_0.field_0.y = dStack_70;
  (this->position).field_0.field_0.z = dStack_68;
  *(undefined8 *)((long)&(this->position).field_0 + 0x18) = uStack_60;
  local_b8.field_0.x = (light_info->direction).field_0.field_0.x;
  local_b8.field_0.y = (light_info->direction).field_0.field_0.y;
  local_b8.field_0.z = (light_info->direction).field_0.field_0.z;
  local_b8.field_0.w = 1.0;
  Matrix4x4::operator*(transform,(Vector4D *)&local_b8.field_0);
  Vector4D::to3D((Vector4D *)&local_98.field_0);
  auVar3._8_8_ = dStack_70;
  auVar3._0_8_ = local_78;
  auVar3 = vsubpd_avx(auVar3,*(undefined1 (*) [16])(this->position).field_0.field_2.__vec);
  dVar1 = (this->position).field_0.field_0.z;
  *(undefined1 (*) [16])(this->direction).field_0.field_2.__vec = auVar3;
  (this->direction).field_0.field_0.z = dStack_68 - dVar1;
  Vector3D::normalize(&this->direction);
  dVar1 = (light_info->up).field_0.field_0.z;
  dVar4 = (light_info->up).field_0.field_0.x;
  dVar5 = (light_info->up).field_0.field_0.y;
  cross(&light_info->up,&light_info->direction);
  local_58.field_0.x = local_78;
  local_58.field_0.y = dStack_70;
  local_58.field_0.z = dStack_68;
  local_58.field_0.w = 1.0;
  Matrix4x4::operator*(transform,(Vector4D *)&local_58.field_0);
  Vector4D::to3D((Vector4D *)&local_b8.field_0);
  auVar3 = vsubpd_avx((undefined1  [16])local_98.field_2.xy,
                      *(undefined1 (*) [16])(this->position).field_0.field_2.__vec);
  dVar2 = (this->position).field_0.field_0.z;
  *(undefined1 (*) [16])(this->dim_x).field_0.field_2.__vec = auVar3;
  (this->dim_x).field_0.field_0.z = local_98.field_0.z - dVar2;
  local_58.field_0.w = 1.0;
  local_58.field_0.x = dVar4;
  local_58.field_0.y = dVar5;
  local_58.field_0.z = dVar1;
  Matrix4x4::operator*(transform,(Vector4D *)&local_58.field_0);
  Vector4D::to3D((Vector4D *)&local_b8.field_0);
  auVar3 = vsubpd_avx((undefined1  [16])local_98.field_2.xy,
                      *(undefined1 (*) [16])(this->position).field_0.field_2.__vec);
  dVar1 = (this->position).field_0.field_0.z;
  *(undefined1 (*) [16])(this->dim_y).field_0.field_2.__vec = auVar3;
  (this->dim_y).field_0.field_0.z = local_98.field_0.z - dVar1;
  return;
}

Assistant:

AreaLight(const Collada::LightInfo& light_info, 
            const Matrix4x4& transform) {

    this->spectrum = light_info.spectrum;
    this->position = (transform * Vector4D(light_info.position, 1)).to3D();
    this->direction = (transform * Vector4D(light_info.direction, 1)).to3D() - position;
    this->direction.normalize();
    
    Vector3D dim_y = light_info.up;
    Vector3D dim_x = cross(light_info.up, light_info.direction);

    this->dim_x = (transform * Vector4D(dim_x, 1)).to3D() - position;
    this->dim_y = (transform * Vector4D(dim_y, 1)).to3D() - position;
  }